

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_abstractlistview.cpp
# Opt level: O3

void QtMWidgets::AbstractListViewBase::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  undefined4 *puVar2;
  long lVar3;
  int iVar4;
  code *UNRECOVERED_JUMPTABLE;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 local_1c;
  void *local_18;
  undefined4 *local_10;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_1c = *_a[1];
      iVar4 = 0;
      break;
    case 1:
      local_1c = *_a[1];
      iVar4 = 1;
      break;
    case 2:
      local_1c = *_a[1];
      iVar4 = 2;
      break;
    case 3:
      uVar6 = *_a[1];
      uVar5 = *_a[2];
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x1c0);
      goto LAB_0014e656;
    case 4:
      (**(code **)(*(long *)_o + 0x1c8))();
      return;
    case 5:
      uVar6 = *_a[1];
      uVar5 = *_a[2];
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x1d0);
      goto LAB_0014e656;
    case 6:
      uVar6 = *_a[1];
      uVar5 = *_a[2];
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x1d8);
LAB_0014e656:
      (*UNRECOVERED_JUMPTABLE)(_o,uVar6,uVar5);
      return;
    case 7:
      (**(code **)(*(long *)_o + 0x1e0))(_o,*_a[1],*_a[2],*_a[3]);
      return;
    case 8:
      (**(code **)(*(long *)_o + 0x1e8))();
      return;
    default:
      goto switchD_0014e4aa_caseD_3;
    }
    local_10 = &local_1c;
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar4,&local_18);
    break;
  case ReadProperty:
    if (_id == 0) {
      piVar1 = (int *)*_a;
      iVar4 = spacing((AbstractListViewBase *)_o);
      *piVar1 = iVar4;
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      setSpacing((AbstractListViewBase *)_o,**_a);
      return;
    }
    break;
  case IndexOfMethod:
    puVar2 = (undefined4 *)*_a;
    UNRECOVERED_JUMPTABLE = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (UNRECOVERED_JUMPTABLE == rowTouched && lVar3 == 0) {
      *puVar2 = 0;
    }
    else if (UNRECOVERED_JUMPTABLE == rowLongTouched && lVar3 == 0) {
      *puVar2 = 1;
    }
    else if (UNRECOVERED_JUMPTABLE == rowDoubleTouched && lVar3 == 0) {
      *puVar2 = 2;
    }
  }
switchD_0014e4aa_caseD_3:
  return;
}

Assistant:

void QtMWidgets::AbstractListViewBase::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<AbstractListViewBase *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->rowTouched((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->rowLongTouched((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->rowDoubleTouched((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 4: _t->modelReset(); break;
        case 5: _t->rowsInserted((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 6: _t->rowsRemoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 7: _t->rowsMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 8: _t->timerElapsed(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (AbstractListViewBase::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListViewBase::rowTouched)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (AbstractListViewBase::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListViewBase::rowLongTouched)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (AbstractListViewBase::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AbstractListViewBase::rowDoubleTouched)) {
                *result = 2;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<AbstractListViewBase *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->spacing(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<AbstractListViewBase *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSpacing(*reinterpret_cast< int*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}